

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  if ((flags & 0x40U) != 0) {
    __assert_fail("(flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x18aa,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  if ((flags & 4U) == 0) {
    switch(flags & 3) {
    case 0:
      window = GImGui->HoveredWindow;
      if (window != GImGui->CurrentWindow) {
        return false;
      }
      break;
    case 1:
      window = GImGui->HoveredWindow;
      if (window == (ImGuiWindow *)0x0) {
        return false;
      }
      bVar3 = IsWindowChildOf(window,GImGui->CurrentWindow);
      if (!bVar3) {
        return false;
      }
      break;
    case 2:
      window = GImGui->HoveredWindow;
      if (window != GImGui->CurrentWindow->RootWindow) {
        return false;
      }
      break;
    case 3:
      if (GImGui->HoveredRootWindow != GImGui->CurrentWindow->RootWindow) {
        return false;
      }
      window = GImGui->HoveredWindow;
    }
  }
  else {
    window = GImGui->HoveredWindow;
    if (window == (ImGuiWindow *)0x0) {
      return false;
    }
  }
  bVar3 = IsWindowContentHoverable(window,flags);
  if ((bVar3) &&
     (((((flags & 0x20U) != 0 || (IVar1 = pIVar2->ActiveId, IVar1 == 0)) ||
       (pIVar2->ActiveIdAllowOverlap != false)) || (IVar1 == window->MoveId)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredRootWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}